

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,empty_statement *param_1)

{
  empty_statement *param_1_local;
  print_visitor *this_local;
  
  std::operator<<(this->os_,';');
  return;
}

Assistant:

void operator()(const empty_statement&) {
        os_ << ';';
    }